

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCOpenings.cpp
# Opt level: O1

size_t Assimp::IFC::CloseWindows
                 (ContourVector *contours,IfcMatrix4 *minv,OpeningRefVector *contours_to_openings,
                 TempMesh *curmesh)

{
  pointer *ppaVar1;
  pointer *ppuVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  uint *puVar10;
  pointer ppTVar11;
  iterator __position;
  iterator iVar12;
  ulong uVar13;
  pointer paVar14;
  bool bVar15;
  ulong uVar16;
  iterator current;
  double *pdVar17;
  long lVar18;
  pointer ppTVar19;
  aiVector3t<double> *paVar20;
  IfcVector2 *proj_point_1;
  pointer paVar21;
  IfcVector2 *proj_point;
  pointer paVar22;
  uint uVar23;
  long lVar24;
  pointer paVar25;
  pointer paVar26;
  int iVar27;
  pointer paVar28;
  ulong *puVar29;
  bool bVar30;
  double dVar31;
  double dVar32;
  double dVar33;
  IfcVector3 start0;
  IfcVector3 contourNormal;
  IfcVector3 start1;
  IfcVector3 world_point;
  OpeningRefs *__range5;
  IfcVector3 local_118;
  size_t local_100;
  IfcVector3 local_f8;
  pointer local_d8;
  uint local_cc;
  aiVector3t<double> local_c8;
  aiVector3t<double> local_a8;
  TempMesh *local_88;
  aiVector3t<double> *local_80;
  aiVector3t<double> *local_78;
  ContourVector *local_70;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_68;
  aiVector3t<double> *local_60;
  aiVector3t<double> *local_58;
  pointer local_50;
  OpeningRefVector *local_48;
  ProjectedWindowContour *local_40;
  pointer local_38;
  
  current._M_current =
       (contours->
       super__Vector_base<Assimp::IFC::ProjectedWindowContour,_std::allocator<Assimp::IFC::ProjectedWindowContour>_>
       )._M_impl.super__Vector_impl_data._M_start;
  local_40 = (contours->
             super__Vector_base<Assimp::IFC::ProjectedWindowContour,_std::allocator<Assimp::IFC::ProjectedWindowContour>_>
             )._M_impl.super__Vector_impl_data._M_finish;
  if (current._M_current == local_40) {
    local_100 = 0;
  }
  else {
    local_68 = &curmesh->mVertcnt;
    local_100 = 0;
    local_88 = curmesh;
    local_70 = contours;
    local_48 = contours_to_openings;
    do {
      paVar25 = ((current._M_current)->contour).
                super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>._M_impl
                .super__Vector_impl_data._M_start;
      paVar22 = ((current._M_current)->contour).
                super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>._M_impl
                .super__Vector_impl_data._M_finish;
      if (paVar25 != paVar22) {
        uVar16 = (ulong)((long)current._M_current -
                        (long)(local_70->
                              super__Vector_base<Assimp::IFC::ProjectedWindowContour,_std::allocator<Assimp::IFC::ProjectedWindowContour>_>
                              )._M_impl.super__Vector_impl_data._M_start) >> 3;
        local_50 = (local_48->
                   super__Vector_base<std::vector<Assimp::IFC::TempOpening_*,_std::allocator<Assimp::IFC::TempOpening_*>_>,_std::allocator<std::vector<Assimp::IFC::TempOpening_*,_std::allocator<Assimp::IFC::TempOpening_*>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
        paVar28 = *(pointer *)((long)local_50 + uVar16 * 0x6276276276276278);
        paVar21 = *(pointer *)((long)local_50 + (uVar16 * 0xc4ec4ec4ec4ec4f + 1) * 8);
        if (paVar28 != paVar21) {
          local_50 = (pointer)((long)local_50 + uVar16 * 0x6276276276276278);
          paVar14 = paVar28;
          do {
            pdVar17 = &paVar14->y;
            bVar15 = false;
            if (*(long *)((long)paVar14->x + 0x40) != *(long *)((long)paVar14->x + 0x48)) {
              bVar15 = true;
              break;
            }
            paVar14 = (pointer)pdVar17;
          } while ((pointer)pdVar17 != paVar21);
          if (bVar15) {
            std::vector<bool,_std::allocator<bool>_>::resize
                      (&(current._M_current)->skiplist,(long)paVar22 - (long)paVar25 >> 4,false);
            FindAdjacentContours(current,local_70);
            FindBorderContours(current);
            if ((current._M_current)->is_rectangular == true) {
              FindLikelyCrossingLines(current);
            }
            puVar29 = ((current._M_current)->skiplist).super__Bvector_base<std::allocator<bool>_>.
                      _M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
            lVar24 = (long)((current._M_current)->contour).
                           super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)((current._M_current)->contour).
                           super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>
                           ._M_impl.super__Vector_impl_data._M_start;
            if ((ulong)((current._M_current)->skiplist).super__Bvector_base<std::allocator<bool>_>.
                       _M_impl.super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset
                + ((long)((current._M_current)->skiplist).super__Bvector_base<std::allocator<bool>_>
                         ._M_impl.super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p -
                  (long)puVar29) * 8 != lVar24 >> 4) {
              __assert_fail("(*it).skiplist.size() == (*it).contour.size()",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/Importer/IFC/IFCOpenings.cpp"
                            ,0x386,
                            "size_t Assimp::IFC::CloseWindows(ContourVector &, const IfcMatrix4 &, OpeningRefVector &, TempMesh &)"
                           );
            }
            std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::reserve
                      (&curmesh->mVerts,
                       (lVar24 >> 2) +
                       ((long)(curmesh->mVerts).
                              super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(curmesh->mVerts).
                              super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                              ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555)
            ;
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve
                      (local_68,((long)((current._M_current)->contour).
                                       super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)((current._M_current)->contour).
                                       super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start >> 4) +
                                ((long)(curmesh->mVertcnt).
                                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)(curmesh->mVertcnt).
                                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                       ._M_impl.super__Vector_impl_data._M_start >> 2));
            puVar10 = (curmesh->mVertcnt).
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_start;
            if ((curmesh->mVertcnt).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_finish == puVar10) {
              bVar15 = false;
            }
            else {
              TempMesh::ComputePolygonNormal
                        (&local_118,
                         (curmesh->mVerts).
                         super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                         ._M_impl.super__Vector_impl_data._M_start,(ulong)*puVar10,true);
              std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::vector
                        ((vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_> *)
                         &local_c8,
                         (long)((current._M_current)->contour).
                               super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                         (long)((current._M_current)->contour).
                               super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>
                               ._M_impl.super__Vector_impl_data._M_start >> 4,
                         (allocator_type *)&local_f8);
              paVar25 = ((current._M_current)->contour).
                        super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              if (((current._M_current)->contour).
                  super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>.
                  _M_impl.super__Vector_impl_data._M_finish != paVar25) {
                lVar24 = 8;
                lVar18 = 0x10;
                uVar16 = 0;
                do {
                  dVar3 = *(double *)((long)paVar25 + lVar24 + -8);
                  dVar31 = *(double *)((long)&paVar25->x + lVar24);
                  dVar32 = minv->b2;
                  dVar33 = minv->b1;
                  dVar4 = minv->b3;
                  dVar5 = minv->b4;
                  dVar6 = minv->c2;
                  dVar7 = minv->c1;
                  dVar8 = minv->c3;
                  dVar9 = minv->c4;
                  *(double *)((long)local_c8.x + lVar18 + -0x10) =
                       minv->a3 * 0.0 + minv->a1 * dVar3 + minv->a2 * dVar31 + minv->a4;
                  *(double *)((long)local_c8.x + lVar18 + -8) =
                       dVar4 * 0.0 + dVar33 * dVar3 + dVar32 * dVar31 + dVar5;
                  *(double *)((long)(double *)local_c8.x + lVar18) =
                       dVar8 * 0.0 + dVar3 * dVar7 + dVar31 * dVar6 + dVar9;
                  uVar16 = uVar16 + 1;
                  paVar25 = ((current._M_current)->contour).
                            super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>
                            ._M_impl.super__Vector_impl_data._M_start;
                  lVar24 = lVar24 + 0x10;
                  lVar18 = lVar18 + 0x18;
                } while (uVar16 < (ulong)((long)((current._M_current)->contour).
                                                super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>
                                                ._M_impl.super__Vector_impl_data._M_finish -
                                          (long)paVar25 >> 4));
              }
              TempMesh::ComputePolygonNormal
                        (&local_f8,(IfcVector3 *)local_c8.x,
                         ((long)local_c8.y - (long)local_c8.x >> 3) * -0x5555555555555555,true);
              bVar15 = 0.0 < local_f8.z * local_118.z +
                             local_f8.x * local_118.x + local_f8.y * local_118.y;
              if ((IfcVector3 *)local_c8.x != (IfcVector3 *)0x0) {
                operator_delete((void *)local_c8.x);
              }
            }
            local_118.x = 0.0;
            local_118.y = 0.0;
            local_118.z = 0.0;
            local_c8.z = 0.0;
            local_c8.x = 0.0;
            local_c8.y = 0.0;
            paVar25 = ((current._M_current)->contour).
                      super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>.
                      _M_impl.super__Vector_impl_data._M_start;
            paVar22 = ((current._M_current)->contour).
                      super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>.
                      _M_impl.super__Vector_impl_data._M_finish;
            if (paVar25 != paVar22) {
              local_60 = &local_f8;
              local_58 = &local_a8;
              if (bVar15) {
                local_60 = &local_a8;
                local_58 = &local_f8;
              }
              local_80 = &local_118;
              local_78 = &local_c8;
              if (bVar15) {
                local_80 = &local_c8;
                local_78 = &local_118;
              }
              local_38 = paVar22 + -1;
              bVar30 = false;
              uVar16 = 0;
              local_d8 = paVar22;
              paVar22 = paVar25;
              do {
                local_f8.x = 0.0;
                local_f8.y = 0.0;
                local_f8.z = 0.0;
                dVar3 = paVar22->x;
                dVar31 = paVar22->y;
                local_a8.x = minv->a3 * 0.0 + minv->a1 * dVar3 + minv->a2 * dVar31 + minv->a4;
                local_a8.y = minv->b3 * 0.0 + minv->b1 * dVar3 + minv->b2 * dVar31 + minv->b4;
                local_a8.z = minv->c3 * 0.0 + dVar3 * minv->c1 + dVar31 * minv->c2 + minv->c4;
                ppTVar19 = (local_50->
                           super__Vector_base<Assimp::IFC::TempOpening_*,_std::allocator<Assimp::IFC::TempOpening_*>_>
                           )._M_impl.super__Vector_impl_data._M_start;
                ppTVar11 = *(pointer *)
                            ((long)&(local_50->
                                    super__Vector_base<Assimp::IFC::TempOpening_*,_std::allocator<Assimp::IFC::TempOpening_*>_>
                                    )._M_impl.super__Vector_impl_data + 8);
                if (ppTVar19 != ppTVar11) {
                  dVar3 = 10000000000.0;
                  do {
                    for (paVar26 = ((*ppTVar19)->wallPoints).
                                   super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start;
                        paVar26 !=
                        *(pointer *)
                         ((long)&((*ppTVar19)->wallPoints).
                                 super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                                 ._M_impl + 8); paVar26 = paVar26 + 1) {
                      dVar32 = local_a8.x - paVar26->x;
                      dVar33 = local_a8.y - paVar26->y;
                      dVar31 = local_a8.z - paVar26->z;
                      dVar31 = dVar31 * dVar31 + dVar32 * dVar32 + dVar33 * dVar33;
                      if ((dVar31 < dVar3) && (1e-05 <= dVar31)) {
                        local_f8.z = paVar26->z;
                        local_f8.x = (double)paVar26->x;
                        local_f8.y = paVar26->y;
                        dVar3 = dVar31;
                      }
                    }
                    ppTVar19 = ppTVar19 + 1;
                  } while (ppTVar19 != ppTVar11);
                }
                if (bVar30) {
                  ppaVar1 = &(curmesh->mVerts).
                             super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish;
                  *ppaVar1 = *ppaVar1 + -2;
                }
                else {
                  bVar30 = (bool)(paVar22 == paVar25 ^ bVar15);
                  paVar20 = &local_f8;
                  if (bVar30) {
                    paVar20 = &local_a8;
                  }
                  iVar12._M_current =
                       (curmesh->mVerts).
                       super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                       _M_impl.super__Vector_impl_data._M_finish;
                  if (iVar12._M_current ==
                      (curmesh->mVerts).
                      super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage) {
                    std::vector<aiVector3t<double>,std::allocator<aiVector3t<double>>>::
                    _M_realloc_insert<aiVector3t<double>const&>
                              ((vector<aiVector3t<double>,std::allocator<aiVector3t<double>>> *)
                               curmesh,iVar12,paVar20);
                  }
                  else {
                    (iVar12._M_current)->z = paVar20->z;
                    dVar3 = paVar20->y;
                    (iVar12._M_current)->x = paVar20->x;
                    (iVar12._M_current)->y = dVar3;
                    ppaVar1 = &(curmesh->mVerts).
                               super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish;
                    *ppaVar1 = *ppaVar1 + 1;
                  }
                  paVar20 = &local_a8;
                  if (bVar30) {
                    paVar20 = &local_f8;
                  }
                  iVar12._M_current =
                       (curmesh->mVerts).
                       super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                       _M_impl.super__Vector_impl_data._M_finish;
                  if (iVar12._M_current ==
                      (curmesh->mVerts).
                      super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage) {
                    std::vector<aiVector3t<double>,std::allocator<aiVector3t<double>>>::
                    _M_realloc_insert<aiVector3t<double>const&>
                              ((vector<aiVector3t<double>,std::allocator<aiVector3t<double>>> *)
                               curmesh,iVar12,paVar20);
                  }
                  else {
                    (iVar12._M_current)->z = paVar20->z;
                    dVar3 = paVar20->y;
                    (iVar12._M_current)->x = paVar20->x;
                    (iVar12._M_current)->y = dVar3;
                    ppaVar1 = &(curmesh->mVerts).
                               super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish;
                    *ppaVar1 = *ppaVar1 + 1;
                  }
                  local_cc = 4;
                  __position._M_current =
                       (curmesh->mVertcnt).
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                       super__Vector_impl_data._M_finish;
                  if (__position._M_current ==
                      (curmesh->mVertcnt).
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage) {
                    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
                    _M_realloc_insert<unsigned_int>(local_68,__position,&local_cc);
                  }
                  else {
                    *__position._M_current = 4;
                    ppuVar2 = &(curmesh->mVertcnt).
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_finish;
                    *ppuVar2 = *ppuVar2 + 1;
                  }
                  local_100 = local_100 + 1;
                }
                if (paVar22 == paVar25) {
                  local_118.z = local_a8.z;
                  local_118.x = local_a8.x;
                  local_118.y = local_a8.y;
                  local_c8.x = local_f8.x;
                  local_c8.y = local_f8.y;
                  local_c8.z = local_f8.z;
                }
                else {
                  iVar12._M_current =
                       (curmesh->mVerts).
                       super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                       _M_impl.super__Vector_impl_data._M_finish;
                  if (iVar12._M_current ==
                      (curmesh->mVerts).
                      super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage) {
                    std::vector<aiVector3t<double>,std::allocator<aiVector3t<double>>>::
                    _M_realloc_insert<aiVector3t<double>const&>
                              ((vector<aiVector3t<double>,std::allocator<aiVector3t<double>>> *)
                               curmesh,iVar12,local_58);
                  }
                  else {
                    (iVar12._M_current)->z = local_58->z;
                    dVar3 = local_58->y;
                    (iVar12._M_current)->x = local_58->x;
                    (iVar12._M_current)->y = dVar3;
                    ppaVar1 = &(curmesh->mVerts).
                               super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish;
                    *ppaVar1 = *ppaVar1 + 1;
                  }
                  iVar12._M_current =
                       (curmesh->mVerts).
                       super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                       _M_impl.super__Vector_impl_data._M_finish;
                  if (iVar12._M_current ==
                      (curmesh->mVerts).
                      super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage) {
                    std::vector<aiVector3t<double>,std::allocator<aiVector3t<double>>>::
                    _M_realloc_insert<aiVector3t<double>const&>
                              ((vector<aiVector3t<double>,std::allocator<aiVector3t<double>>> *)
                               curmesh,iVar12,local_60);
                  }
                  else {
                    (iVar12._M_current)->z = local_60->z;
                    dVar3 = local_60->y;
                    (iVar12._M_current)->x = local_60->x;
                    (iVar12._M_current)->y = dVar3;
                    ppaVar1 = &(curmesh->mVerts).
                               super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish;
                    *ppaVar1 = *ppaVar1 + 1;
                  }
                  if (paVar22 == local_38) {
                    if ((*puVar29 >> (uVar16 & 0x3f) & 1) == 0) {
                      iVar12._M_current =
                           (curmesh->mVerts).
                           super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish;
                      if (iVar12._M_current ==
                          (curmesh->mVerts).
                          super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                        std::vector<aiVector3t<double>,std::allocator<aiVector3t<double>>>::
                        _M_realloc_insert<aiVector3t<double>const&>
                                  ((vector<aiVector3t<double>,std::allocator<aiVector3t<double>>> *)
                                   curmesh,iVar12,local_78);
                      }
                      else {
                        (iVar12._M_current)->z = local_78->z;
                        dVar3 = local_78->y;
                        (iVar12._M_current)->x = local_78->x;
                        (iVar12._M_current)->y = dVar3;
                        ppaVar1 = &(curmesh->mVerts).
                                   super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish;
                        *ppaVar1 = *ppaVar1 + 1;
                      }
                      iVar12._M_current =
                           (curmesh->mVerts).
                           super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish;
                      if (iVar12._M_current ==
                          (curmesh->mVerts).
                          super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                        std::vector<aiVector3t<double>,std::allocator<aiVector3t<double>>>::
                        _M_realloc_insert<aiVector3t<double>const&>
                                  ((vector<aiVector3t<double>,std::allocator<aiVector3t<double>>> *)
                                   curmesh,iVar12,local_80);
                      }
                      else {
                        (iVar12._M_current)->z = local_80->z;
                        dVar3 = local_80->y;
                        (iVar12._M_current)->x = local_80->x;
                        (iVar12._M_current)->y = dVar3;
                        ppaVar1 = &(curmesh->mVerts).
                                   super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish;
                        *ppaVar1 = *ppaVar1 + 1;
                      }
                    }
                    else {
                      ppuVar2 = &(curmesh->mVertcnt).
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_finish;
                      *ppuVar2 = *ppuVar2 + -1;
                      local_100 = local_100 - 1;
                      ppaVar1 = &(curmesh->mVerts).
                                 super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish;
                      *ppaVar1 = *ppaVar1 + -2;
                    }
                  }
                }
                paVar22 = paVar22 + 1;
                iVar27 = (int)uVar16;
                uVar13 = *puVar29;
                puVar29 = puVar29 + (iVar27 == 0x3f);
                uVar23 = iVar27 + 1;
                if (iVar27 == 0x3f) {
                  uVar23 = 0;
                }
                bVar30 = (uVar13 >> (uVar16 & 0x3f) & 1) != 0;
                uVar16 = (ulong)uVar23;
              } while (paVar22 != local_d8);
            }
            goto LAB_005dd6df;
          }
        }
        curmesh = local_88;
        local_d8 = paVar21;
        if (paVar28 != paVar21) {
          do {
            dVar3 = paVar28->x;
            if (*(long *)((long)dVar3 + 0x40) != *(long *)((long)dVar3 + 0x48)) {
              __assert_fail("opening->wallPoints.empty()",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/Importer/IFC/IFCOpenings.cpp"
                            ,0x3ec,
                            "size_t Assimp::IFC::CloseWindows(ContourVector &, const IfcMatrix4 &, OpeningRefVector &, TempMesh &)"
                           );
            }
            std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::reserve
                      ((vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_> *)
                       ((long)dVar3 + 0x40),
                       ((long)((current._M_current)->contour).
                              super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)((current._M_current)->contour).
                              super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>
                              ._M_impl.super__Vector_impl_data._M_start >> 4) +
                       (*(long *)((long)dVar3 + 0x50) - *(long *)((long)dVar3 + 0x40) >> 3) *
                       -0x5555555555555555);
            curmesh = local_88;
            for (paVar21 = paVar25; local_88 = curmesh, paVar21 != paVar22; paVar21 = paVar21 + 1) {
              dVar31 = paVar21->x;
              dVar32 = paVar21->y;
              local_118.x = minv->a3 * 0.0 + minv->a1 * dVar31 + minv->a2 * dVar32 + minv->a4;
              local_118.y = minv->b3 * 0.0 + minv->b1 * dVar31 + minv->b2 * dVar32 + minv->b4;
              local_118.z = minv->c3 * 0.0 + dVar31 * minv->c1 + dVar32 * minv->c2 + minv->c4;
              iVar12._M_current = *(aiVector3t<double> **)((long)dVar3 + 0x48);
              if (iVar12._M_current == *(aiVector3t<double> **)((long)dVar3 + 0x50)) {
                std::vector<aiVector3t<double>,std::allocator<aiVector3t<double>>>::
                _M_realloc_insert<aiVector3t<double>>
                          ((vector<aiVector3t<double>,std::allocator<aiVector3t<double>>> *)
                           ((long)dVar3 + 0x40),iVar12,&local_118);
              }
              else {
                (iVar12._M_current)->z = local_118.z;
                (iVar12._M_current)->x = local_118.x;
                (iVar12._M_current)->y = local_118.y;
                *(long *)((long)dVar3 + 0x48) = *(long *)((long)dVar3 + 0x48) + 0x18;
              }
              curmesh = local_88;
            }
            paVar28 = (pointer)&paVar28->y;
          } while (paVar28 != local_d8);
        }
      }
LAB_005dd6df:
      current._M_current = current._M_current + 1;
    } while (current._M_current != local_40);
  }
  return local_100;
}

Assistant:

size_t CloseWindows(ContourVector& contours,
    const IfcMatrix4& minv,
    OpeningRefVector& contours_to_openings,
    TempMesh& curmesh)
{
    size_t closed = 0;
    // For all contour points, check if one of the assigned openings does
    // already have points assigned to it. In this case, assume this is
    // the other side of the wall and generate connections between
    // the two holes in order to close the window.

    // All this gets complicated by the fact that contours may pertain to
    // multiple openings(due to merging of adjacent or overlapping openings).
    // The code is based on the assumption that this happens symmetrically
    // on both sides of the wall. If it doesn't (which would be a bug anyway)
    // wrong geometry may be generated.
    for (ContourVector::iterator it = contours.begin(), end = contours.end(); it != end; ++it) {
        if ((*it).IsInvalid()) {
            continue;
        }
        OpeningRefs& refs = contours_to_openings[std::distance(contours.begin(), it)];

        bool has_other_side = false;
        for(const TempOpening* opening : refs) {
            if(!opening->wallPoints.empty()) {
                has_other_side = true;
                break;
            }
        }

        if (has_other_side) {

            ContourRefVector adjacent_contours;

            // prepare a skiplist for this contour. The skiplist is used to
            // eliminate unwanted contour lines for adjacent windows and
            // those bordering the outer frame.
            (*it).PrepareSkiplist();

            FindAdjacentContours(it, contours);
            FindBorderContours(it);

            // if the window is the result of a finite union or intersection of rectangles,
            // there shouldn't be any crossing or diagonal lines in it. Such lines would
            // be artifacts caused by numerical inaccuracies or other bugs in polyclipper
            // and our own code. Since rectangular openings are by far the most frequent
            // case, it is worth filtering for this corner case.
            if((*it).is_rectangular) {
                FindLikelyCrossingLines(it);
            }

            ai_assert((*it).skiplist.size() == (*it).contour.size());

            SkipList::const_iterator skipbegin = (*it).skiplist.begin();

            curmesh.mVerts.reserve(curmesh.mVerts.size() + (*it).contour.size() * 4);
            curmesh.mVertcnt.reserve(curmesh.mVertcnt.size() + (*it).contour.size());

			bool reverseCountourFaces = false;

            // compare base poly normal and contour normal to detect if we need to reverse the face winding
			if(curmesh.mVertcnt.size() > 0) {
				IfcVector3 basePolyNormal = TempMesh::ComputePolygonNormal(curmesh.mVerts.data(), curmesh.mVertcnt.front());
				
				std::vector<IfcVector3> worldSpaceContourVtx(it->contour.size());
				
				for(size_t a = 0; a < it->contour.size(); ++a)
					worldSpaceContourVtx[a] = minv * IfcVector3(it->contour[a].x, it->contour[a].y, 0.0);
				
				IfcVector3 contourNormal = TempMesh::ComputePolygonNormal(worldSpaceContourVtx.data(), worldSpaceContourVtx.size());
				
				reverseCountourFaces = (contourNormal * basePolyNormal) > 0.0;
			}

            // XXX this algorithm is really a bit inefficient - both in terms
            // of constant factor and of asymptotic runtime.
            std::vector<bool>::const_iterator skipit = skipbegin;

            IfcVector3 start0;
            IfcVector3 start1;

            const Contour::const_iterator cbegin = (*it).contour.begin(), cend = (*it).contour.end();

            bool drop_this_edge = false;
            for (Contour::const_iterator cit = cbegin; cit != cend; ++cit, drop_this_edge = *skipit++) {
                const IfcVector2& proj_point = *cit;

                // Locate the closest opposite point. This should be a good heuristic to
                // connect only the points that are really intended to be connected.
                IfcFloat best = static_cast<IfcFloat>(1e10);
                IfcVector3 bestv;

                const IfcVector3 world_point = minv * IfcVector3(proj_point.x,proj_point.y,0.0f);

                for(const TempOpening* opening : refs) {
                    for(const IfcVector3& other : opening->wallPoints) {
                        const IfcFloat sqdist = (world_point - other).SquareLength();

                        if (sqdist < best) {
                            // avoid self-connections
                            if(sqdist < 1e-5) {
                                continue;
                            }

                            bestv = other;
                            best = sqdist;
                        }
                    }
                }

                if (drop_this_edge) {
                    curmesh.mVerts.pop_back();
                    curmesh.mVerts.pop_back();
                }
                else {
                    curmesh.mVerts.push_back(((cit == cbegin) != reverseCountourFaces) ? world_point : bestv);
                    curmesh.mVerts.push_back(((cit == cbegin) != reverseCountourFaces) ? bestv : world_point);

                    curmesh.mVertcnt.push_back(4);
                    ++closed;
                }

                if (cit == cbegin) {
                    start0 = world_point;
                    start1 = bestv;
                    continue;
                }

                curmesh.mVerts.push_back(reverseCountourFaces ? bestv : world_point);
                curmesh.mVerts.push_back(reverseCountourFaces ? world_point : bestv);

                if (cit == cend - 1) {
                    drop_this_edge = *skipit;

                    // Check if the final connection (last to first element) is itself
                    // a border edge that needs to be dropped.
                    if (drop_this_edge) {
                        --closed;
                        curmesh.mVertcnt.pop_back();
                        curmesh.mVerts.pop_back();
                        curmesh.mVerts.pop_back();
                    }
                    else {
                        curmesh.mVerts.push_back(reverseCountourFaces ? start0 : start1);
                        curmesh.mVerts.push_back(reverseCountourFaces ? start1 : start0);
                    }
                }
            }
        }
        else {

            const Contour::const_iterator cbegin = (*it).contour.begin(), cend = (*it).contour.end();
            for(TempOpening* opening : refs) {
                ai_assert(opening->wallPoints.empty());
                opening->wallPoints.reserve(opening->wallPoints.capacity() + (*it).contour.size());
                for (Contour::const_iterator cit = cbegin; cit != cend; ++cit) {

                    const IfcVector2& proj_point = *cit;
                    opening->wallPoints.push_back(minv * IfcVector3(proj_point.x,proj_point.y,0.0f));
                }
            }
        }
    }
    return closed;
}